

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O3

void higan::System::DaemonRun(void)

{
  __pid_t _Var1;
  int __fd;
  
  signal(0x11,(__sighandler_t)0x1);
  _Var1 = fork();
  if (_Var1 < 0) {
    DaemonRun();
  }
  else if (_Var1 == 0) {
    setsid();
    __fd = open("/dev/null",2,0);
    if (__fd != -1) {
      dup2(__fd,0);
      dup2(__fd,1);
      dup2(__fd,2);
      if (2 < __fd) {
        close(__fd);
        return;
      }
    }
    return;
  }
  exit(0);
}

Assistant:

void System::DaemonRun()
{
	signal(SIGCHLD, SIG_IGN);
	int pid = fork();
	if (pid <  0)
	{
		fprintf(stderr, "fork error\n");
		exit(-1);
	}
	else if (pid > 0)
	{
		exit(0);
	}

	setsid();
	int fd = open("/dev/null", O_RDWR, 0);
	if (fd != -1)
	{
		dup2(fd, STDIN_FILENO);
		dup2(fd, STDOUT_FILENO);
		dup2(fd, STDERR_FILENO);
	}
	if (fd > 2)
	{
		close(fd);
	}
}